

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O1

void __thiscall
hdc::SymbolTableBuilderVisitor::visit(SymbolTableBuilderVisitor *this,PlusExpression *expression)

{
  int iVar1;
  int iVar2;
  Expression *pEVar3;
  Type *pTVar4;
  Type *pTVar5;
  undefined4 extraout_var;
  
  pEVar3 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar3->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar3,this);
  pTVar4 = this->lastType;
  pEVar3 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar3->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar3,this);
  pTVar5 = this->lastType;
  iVar1 = (*(pTVar4->super_ASTNode)._vptr_ASTNode[5])(pTVar4);
  iVar2 = (*(pTVar5->super_ASTNode)._vptr_ASTNode[5])(pTVar5);
  if (iVar2 < iVar1) {
    pTVar5 = pTVar4;
  }
  iVar1 = (*(pTVar5->super_ASTNode)._vptr_ASTNode[3])(pTVar5);
  pTVar4 = (Type *)CONCAT44(extraout_var,iVar1);
  Expression::setType((Expression *)expression,pTVar4);
  this->lastType = pTVar4;
  if (pTVar4 != (Type *)0x0) {
    (**(pTVar4->super_ASTNode)._vptr_ASTNode)(pTVar4,this);
    return;
  }
  return;
}

Assistant:

void SymbolTableBuilderVisitor::visit(PlusExpression* expression) {
    Type* left;
    Type* right;
    Type* type;

    expression->getLeft()->accept(this);
    left = lastType;

    expression->getRight()->accept(this);
    right = lastType;

    type = typeCoercion(left, right);
    expression->setType(type);
    setLastType(type);
}